

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O2

int up_scale_image(uchar *orig,int width,int height,int channels,uchar *resampled,
                  int resampled_width,int resampled_height)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  byte *pbVar10;
  float fVar11;
  float fVar12;
  
  iVar1 = 0;
  iVar8 = 0;
  if ((((resampled != (uchar *)0x0) && (iVar8 = 0, orig != (uchar *)0x0)) &&
      (iVar8 = iVar1, 0 < channels)) &&
     (((0 < width && (0 < height)) && ((1 < resampled_width && (1 < resampled_height)))))) {
    iVar8 = 0;
    for (uVar2 = 0; uVar2 != (uint)resampled_height; uVar2 = uVar2 + 1) {
      fVar11 = (float)(int)uVar2 * (((float)height + -1.0) / ((float)resampled_height + -1.0));
      iVar1 = (int)fVar11;
      if (height + -2 < iVar1) {
        iVar1 = height + -2;
      }
      fVar11 = fVar11 - (float)iVar1;
      iVar7 = iVar8;
      for (uVar9 = 0; uVar9 != (uint)resampled_width; uVar9 = uVar9 + 1) {
        fVar12 = (float)(int)uVar9 * (((float)width + -1.0) / ((float)resampled_width + -1.0));
        iVar3 = (int)fVar12;
        if (width + -2 < iVar3) {
          iVar3 = width + -2;
        }
        fVar12 = fVar12 - (float)iVar3;
        lVar4 = (long)((iVar3 + iVar1 * width) * channels);
        pbVar10 = orig + lVar4 + (ulong)(uint)channels;
        pbVar5 = orig + lVar4;
        for (uVar6 = 0; (uint)channels != uVar6; uVar6 = uVar6 + 1) {
          resampled[uVar6 + (long)iVar7] =
               (uchar)(int)((float)pbVar10[channels * width] * fVar12 * fVar11 +
                           (float)pbVar5[channels * width] * (1.0 - fVar12) * fVar11 +
                           (float)*pbVar10 * fVar12 * (1.0 - fVar11) +
                           (float)*pbVar5 * (1.0 - fVar12) * (1.0 - fVar11) + 0.5);
          pbVar10 = pbVar10 + 1;
          pbVar5 = pbVar5 + 1;
        }
        iVar7 = iVar7 + channels;
      }
      iVar8 = iVar8 + resampled_width * channels;
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int
	up_scale_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int resampled_width, int resampled_height
	)
{
	float dx, dy;
	int x, y, c;

    /* error(s) check	*/
    if ( 	(width < 1) || (height < 1) ||
            (resampled_width < 2) || (resampled_height < 2) ||
            (channels < 1) ||
            (NULL == orig) || (NULL == resampled) )
    {
        /*	signify badness	*/
        return 0;
    }
    /*
		for each given pixel in the new map, find the exact location
		from the original map which would contribute to this guy
	*/
    dx = (width - 1.0f) / (resampled_width - 1.0f);
    dy = (height - 1.0f) / (resampled_height - 1.0f);
    for ( y = 0; y < resampled_height; ++y )
    {
    	/* find the base y index and fractional offset from that	*/
    	float sampley = y * dy;
    	int inty = (int)sampley;
    	/*	if( inty < 0 ) { inty = 0; } else	*/
		if( inty > height - 2 ) { inty = height - 2; }
		sampley -= inty;
        for ( x = 0; x < resampled_width; ++x )
        {
			float samplex = x * dx;
			int intx = (int)samplex;
			int base_index;
			/* find the base x index and fractional offset from that	*/
			/*	if( intx < 0 ) { intx = 0; } else	*/
			if( intx > width - 2 ) { intx = width - 2; }
			samplex -= intx;
			/*	base index into the original image	*/
			base_index = (inty * width + intx) * channels;
            for ( c = 0; c < channels; ++c )
            {
            	/*	do the sampling	*/
				float value = 0.5f;
				value += orig[base_index]
							*(1.0f-samplex)*(1.0f-sampley);
				value += orig[base_index+channels]
							*(samplex)*(1.0f-sampley);
				value += orig[base_index+width*channels]
							*(1.0f-samplex)*(sampley);
				value += orig[base_index+width*channels+channels]
							*(samplex)*(sampley);
				/*	move to the next channel	*/
				++base_index;
            	/*	save the new value	*/
            	resampled[y*resampled_width*channels+x*channels+c] =
						(unsigned char)(value);
            }
        }
    }
    /*	done	*/
    return 1;
}